

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::remap_descriptor_set_layout_ci
          (Impl *this,VkDescriptorSetLayoutCreateInfo *info)

{
  VkDescriptorSetLayoutBinding *pVVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  VkSampler *out_sampler;
  ulong uVar5;
  
  uVar4 = info->bindingCount;
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      pVVar1 = info->pBindings;
      out_sampler = pVVar1[uVar5].pImmutableSamplers;
      if (((out_sampler != (VkSampler *)0x0) &&
          (pVVar1[uVar5].descriptorType < VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE)) &&
         (pVVar1[uVar5].descriptorCount != 0)) {
        uVar3 = 0;
        do {
          bVar2 = remap_sampler_handle(this,*out_sampler,out_sampler);
          if (!bVar2) {
            return false;
          }
          uVar3 = uVar3 + 1;
          out_sampler = out_sampler + 1;
        } while (uVar3 < pVVar1[uVar5].descriptorCount);
        uVar4 = info->bindingCount;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
  }
  return true;
}

Assistant:

bool StateRecorder::Impl::remap_descriptor_set_layout_ci(VkDescriptorSetLayoutCreateInfo *info)
{
	for (uint32_t i = 0; i < info->bindingCount; i++)
	{
		auto &b = const_cast<VkDescriptorSetLayoutBinding &>(info->pBindings[i]);
		if (b.pImmutableSamplers &&
		    (b.descriptorType == VK_DESCRIPTOR_TYPE_SAMPLER ||
		     b.descriptorType == VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER))
		{
			auto *immutable_samplers = const_cast<VkSampler *>(b.pImmutableSamplers);
			for (uint32_t j = 0; j < b.descriptorCount; j++)
				if (!remap_sampler_handle(immutable_samplers[j], &immutable_samplers[j]))
					return false;
		}
	}

	return true;
}